

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O3

void __thiscall
duckdb::HistogramBinFinalizeFunction<duckdb::HistogramGenericFunctor,duckdb::string_t>
          (duckdb *this,Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
          idx_t offset)

{
  long *plVar1;
  ArenaAllocator *pAVar2;
  data_ptr_t pdVar3;
  ArenaAllocator *this_00;
  byte bVar4;
  undefined8 uVar5;
  element_type *peVar6;
  bool bVar7;
  Allocator *index;
  LogicalType *type;
  Vector *this_01;
  Vector *pVVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  long *plVar11;
  ulong uVar12;
  Allocator **ppAVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  OrderModifiers modifiers;
  long lVar17;
  string_t sort_key;
  UnifiedVectorFormat sdata;
  unsigned_long local_c8;
  UnifiedVectorFormat local_c0;
  Value local_78;
  
  modifiers = SUB82(offset,0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)result,&local_c0);
  FlatVector::VerifyFlatVector((Vector *)param_2);
  index = (Allocator *)ListVector::GetListSize((Vector *)param_2);
  type = MapType::KeyType((LogicalType *)&param_2->allocator);
  bVar7 = SupportsOtherBucket(type);
  if (result == (Vector *)0x0) {
    lVar16 = 0;
  }
  else {
    lVar16 = 0;
    uVar12 = 0;
    do {
      uVar15 = uVar12;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)(local_c0.sel)->sel_vector[uVar12];
      }
      plVar1 = (long *)**(long **)(local_c0.data + uVar15 * 8);
      if (plVar1 != (long *)0x0) {
        lVar16 = (ulong)(*(long *)(*(long *)((*(long **)(local_c0.data + uVar15 * 8))[1] + 8) + -8)
                         != 0 && bVar7) + (plVar1[1] - *plVar1 >> 4) + lVar16;
      }
      uVar12 = uVar12 + 1;
    } while (result != (Vector *)uVar12);
  }
  ListVector::Reserve((Vector *)param_2,(long)&index->allocate_function + lVar16);
  this_01 = MapVector::GetKeys((Vector *)param_2);
  pVVar8 = MapVector::GetValues((Vector *)param_2);
  if (result != (Vector *)0x0) {
    pAVar2 = param_2[1].allocator;
    pdVar3 = pVVar8->data;
    uVar12 = 0;
    do {
      uVar15 = uVar12;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar15 = (ulong)(local_c0.sel)->sel_vector[uVar12];
      }
      uVar14 = uVar12 + count;
      plVar1 = *(long **)(local_c0.data + uVar15 * 8);
      plVar11 = (long *)*plVar1;
      if (plVar11 == (long *)0x0) {
        _Var10._M_head_impl = *(unsigned_long **)&param_2[1].combine_type;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_c8 = *(unsigned_long *)&param_2[2].combine_type;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          peVar6 = local_78.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar5 = local_78.type_._0_8_;
          local_78.type_._0_8_ = (FunctionData *)0x0;
          local_78.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          this_00 = param_2[2].allocator;
          param_2[2].bind_data.ptr = (FunctionData *)uVar5;
          param_2[2].allocator = (ArenaAllocator *)peVar6;
          if ((this_00 != (ArenaAllocator *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
             (ArenaAllocator *)
             local_78.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (ArenaAllocator *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_78.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                              (param_2 + 2));
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)&param_2[1].combine_type = _Var10._M_head_impl;
        }
        bVar4 = (byte)uVar14 & 0x3f;
        _Var10._M_head_impl[uVar14 >> 6] =
             _Var10._M_head_impl[uVar14 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      else {
        (&pAVar2->allocator)[uVar14 * 2] = index;
        lVar16 = *plVar11;
        if (plVar11[1] == lVar16) {
          plVar11 = (long *)plVar1[1];
        }
        else {
          lVar17 = 8;
          uVar15 = 0;
          do {
            sort_key.value.pointer.ptr = (char *)this_01;
            sort_key.value._0_8_ = *(undefined8 *)(lVar16 + lVar17);
            CreateSortKeyHelpers::DecodeSortKey
                      (*(CreateSortKeyHelpers **)(lVar16 + -8 + lVar17),sort_key,
                       (Vector *)((long)&index->allocate_function + uVar15),0x302,modifiers);
            plVar11 = (long *)plVar1[1];
            *(undefined8 *)(pdVar3 + uVar15 * 8 + (long)index * 8) =
                 *(undefined8 *)(*plVar11 + uVar15 * 8);
            uVar15 = uVar15 + 1;
            lVar16 = *(long *)*plVar1;
            lVar17 = lVar17 + 0x10;
          } while (uVar15 < (ulong)(((long *)*plVar1)[1] - lVar16 >> 4));
          index = (Allocator *)((long)&index->allocate_function + uVar15);
        }
        if (bVar7 && *(long *)(plVar11[1] + -8) != 0) {
          OtherBucketValue(&local_78,&this_01->type);
          Vector::SetValue(this_01,(idx_t)index,&local_78);
          Value::~Value(&local_78);
          *(undefined8 *)(pdVar3 + (long)index * 8) = *(undefined8 *)(*(long *)(plVar1[1] + 8) + -8)
          ;
          index = (Allocator *)((long)&index->allocate_function + 1);
        }
        ppAVar13 = &pAVar2->allocator + uVar14 * 2;
        ppAVar13[1] = (Allocator *)((long)index - (long)*ppAVar13);
      }
      uVar12 = uVar12 + 1;
    } while ((Vector *)uVar12 != result);
  }
  ListVector::SetListSize((Vector *)param_2,(idx_t)index);
  Vector::Verify((Vector *)param_2,(idx_t)result);
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}